

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

void bcache_remove_clean_blocks(filemgr *file)

{
  __pointer_type pfVar1;
  list_elem *e_00;
  hash *in_RDI;
  size_t i;
  fnamedic_item *fname_item;
  bcache_item *item;
  list_elem *e;
  ulong local_28;
  
  pfVar1 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x12961a);
  if (pfVar1 != (__pointer_type)0x0) {
    for (local_28 = 0; local_28 < pfVar1->num_shards; local_28 = local_28 + 1) {
      pthread_spin_lock(&pfVar1->shards[local_28].lock);
      e_00 = list_begin(&pfVar1->shards[local_28].cleanlist);
      while (e_00 != (list_elem *)0x0) {
        e_00 = list_remove(&pfVar1->shards[local_28].cleanlist,e_00);
        hash_remove(in_RDI,(hash_elem *)e_00);
        _bcache_release_freeblock((bcache_item *)0x1296e2);
      }
      pthread_spin_unlock(&pfVar1->shards[local_28].lock);
    }
  }
  return;
}

Assistant:

void bcache_remove_clean_blocks(struct filemgr *file)
{
    struct list_elem *e;
    struct bcache_item *item;
    struct fnamedic_item *fname_item;

    fname_item = file->bcache;

    if (fname_item) {
        // Note that this function is only invoked as part of database file close or
        // removal when there are no database handles for a given file. Therefore,
        // we don't need to grab all the shard locks at once.

        // remove all clean blocks from each shard in a file.
        size_t i = 0;
        for (; i < fname_item->num_shards; ++i) {
            spin_lock(&fname_item->shards[i].lock);
            e = list_begin(&fname_item->shards[i].cleanlist);
            while(e){
                item = _get_entry(e, struct bcache_item, list_elem);
                // remove from clean list
                e = list_remove(&fname_item->shards[i].cleanlist, e);
                // remove from hash table
                hash_remove(&fname_item->shards[i].hashtable, &item->hash_elem);
                // insert into free list
                _bcache_release_freeblock(item);
            }
            spin_unlock(&fname_item->shards[i].lock);
        }
    }
}